

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

void __thiscall wasm::Asyncify::run(Asyncify *this,Module *module)

{
  size_type *psVar1;
  size_type *psVar2;
  pointer puVar3;
  pointer puVar4;
  Export *pEVar5;
  pointer puVar6;
  char *pcVar7;
  long *plVar8;
  Name *__args;
  size_t sVar9;
  long lVar10;
  pointer pbVar11;
  pointer pNVar12;
  _Alloc_hider _Var13;
  _Base_ptr p_Var14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  char cVar21;
  int iVar22;
  int *piVar23;
  Address secondaryMemorySize;
  pointer puVar24;
  Memory *pMVar25;
  _Rb_tree_node_base *p_Var26;
  long *plVar27;
  string_view *psVar28;
  mapped_type *pmVar29;
  Expression *pEVar30;
  mapped_type *pmVar31;
  mapped_type *pmVar32;
  _Base_ptr p_Var33;
  ostream *poVar34;
  _Base_ptr p_Var35;
  _Any_data *item;
  Function *pFVar36;
  mapped_type *pmVar37;
  ulong uVar38;
  _Rb_tree_header *p_Var39;
  undefined1 reuse;
  _Rb_tree_node_base *__tmp;
  string *defaultValue;
  _Rb_tree_header *p_Var40;
  variant<wasm::Name,_wasm::HeapType> *pvVar41;
  TypeInfos *extraout_RDX;
  pointer puVar42;
  pointer pNVar43;
  undefined1 auVar44 [8];
  _Any_data *p_Var45;
  _Rb_tree_header *p_Var46;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *logging;
  pointer puVar47;
  int iVar48;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  string_view sVar53;
  pair<std::_Rb_tree_iterator<wasm::Function_*>,_std::_Rb_tree_iterator<wasm::Function_*>_> pVar54;
  string_view s;
  string_view s_00;
  string_view s_01;
  Name name;
  Name name_00;
  undefined1 local_c78 [8];
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  renamings;
  Type type;
  long local_c38 [2];
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_c28;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_bf8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_bc8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b98;
  undefined1 local_b68 [8];
  Function *func_1;
  char local_b48;
  Split local_b40;
  Split local_b20;
  undefined1 local_b00 [8];
  Split listedImports;
  long local_ad0 [2];
  char local_ac0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_ab8;
  bool local_a98;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a90;
  bool local_a70;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a68;
  bool local_a48;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a40;
  bool local_a20;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a18;
  bool local_9f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_9f0;
  bool local_9d0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_9c8;
  bool local_9a8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_9a0;
  bool local_980;
  string local_978;
  string local_958;
  string local_938;
  undefined1 local_918 [8];
  string ignoreImports;
  string stateChangingImports;
  long local_8c8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  _Hash_node_base local_7b8;
  undefined8 uStack_7b0;
  code *local_7a8;
  code *pcStack_7a0;
  undefined1 local_790 [8];
  string removeListInput;
  string onlyListInput;
  map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
  local_740;
  undefined1 local_710 [8];
  _Base_ptr *local_708;
  size_type local_700;
  __node_base local_6f8;
  size_type sStack_6f0;
  float local_6e8;
  size_t local_6e0;
  _Base_ptr p_Stack_6d8;
  _Base_ptr *local_6d0;
  size_type local_6c8;
  __node_base local_6c0;
  size_type sStack_6b8;
  float local_6b0;
  size_t local_6a8;
  _Base_ptr p_Stack_6a0;
  char local_698;
  undefined **local_690;
  _Alloc_hider local_688;
  string prefix;
  _Hash_node_base local_5a8;
  undefined1 *local_5a0;
  code *local_598;
  code *local_590;
  undefined1 auStack_588 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  loggings;
  Split local_568;
  Split local_548;
  PassRunner *local_528;
  pointer pcStack_520;
  undefined1 auStack_518 [8];
  __single_object glob;
  undefined1 local_508 [16];
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_4f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_498;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_468;
  undefined1 auStack_438 [8];
  FuncSet instrumentedFuncs;
  _Any_data local_348;
  code *local_338;
  code *local_330;
  Split local_328;
  _Any_data *local_300;
  pointer pNStack_2f8;
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcsToDelete;
  _Any_data local_2d8;
  code *local_2c8;
  code *local_2c0;
  undefined1 local_2b8 [8];
  __uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_> local_2b0;
  _Head_base<0UL,_wasm::Pass_*,_false> local_2a8;
  __node_base local_2a0;
  _Any_data local_298;
  code *local_288;
  code *local_280;
  int local_26c;
  undefined1 auStack_268 [8];
  string secondaryMemorySizeString;
  undefined1 auStack_218 [8];
  bool local_210;
  undefined7 uStack_20f;
  _Storage<std::basic_ostream<char,_std::char_traits<char>_>_*,_true> local_208;
  ulong uStack_200;
  float local_1f8;
  __buckets_ptr local_1f0;
  __node_base_ptr p_Stack_1e8;
  __node_base local_1e0;
  size_type sStack_1d8;
  float local_1d0;
  size_t local_1c8;
  __node_base_ptr p_Stack_1c0;
  __node_base_ptr *local_1b8;
  size_type local_1b0;
  __node_base local_1a8;
  size_type sStack_1a0;
  float local_198;
  size_t local_190;
  __node_base_ptr p_Stack_188;
  undefined2 local_180;
  undefined1 *local_178;
  void *local_160;
  long local_150;
  _Any_data local_128;
  code *local_118;
  _Rb_tree_node_base *local_d8;
  size_t sStack_d0;
  Module *local_c0;
  map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
  local_b8;
  undefined1 auStack_88 [8];
  ParallelFunctionAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis_1;
  bool allImportsCanChangeState;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range4;
  char cStack_31;
  
  iVar48 = (((this->super_Pass).runner)->options).optimizeLevel;
  glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
       (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)auStack_518;
  auStack_518 = (undefined1  [8])local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_518,"asyncify-imports","");
  local_688._M_p = (pointer)&prefix._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff978,"");
  Pass::getArgumentOrDefault
            ((string *)auStack_438,&this->super_Pass,(string *)auStack_518,
             (string *)&stack0xfffffffffffff978);
  read_possible_response_file((string *)auStack_268,(string *)auStack_438);
  String::trim((string *)((long)&ignoreImports.field_2 + 8),(string *)auStack_268);
  if (auStack_268 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
    operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
  }
  psVar1 = &instrumentedFuncs._M_h._M_bucket_count;
  if (auStack_438 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_438,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  if ((size_type *)local_688._M_p != &prefix._M_string_length) {
    operator_delete(local_688._M_p,prefix._M_string_length + 1);
  }
  if (auStack_518 != (undefined1  [8])local_508) {
    operator_delete((void *)auStack_518,(ulong)(local_508._0_8_ + 1));
  }
  auStack_268 = (undefined1  [8])&secondaryMemorySizeString._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_268,"asyncify-ignore-imports","");
  auStack_438 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_438,"");
  Pass::getArgumentOrDefault
            ((string *)local_918,&this->super_Pass,(string *)auStack_268,(string *)auStack_438);
  if (auStack_438 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_438,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  if (auStack_268 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
    operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
  }
  iVar22 = std::__cxx11::string::compare(ignoreImports.field_2._M_local_buf + 8);
  if (iVar22 == 0) {
    iVar22 = std::__cxx11::string::compare(local_918);
    analysis_1._53_1_ = iVar22 == 0;
  }
  else {
    analysis_1._53_1_ = false;
  }
  auStack_438 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_438,",","");
  auStack_268 = (undefined1  [8])&secondaryMemorySizeString._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_268,auStack_438,
             (pointer)((long)instrumentedFuncs._M_h._M_buckets + (long)auStack_438));
  String::Split::Split
            ((Split *)local_b00,(string *)((long)&ignoreImports.field_2 + 8),
             (NewLineOr *)auStack_268);
  if (auStack_268 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
    operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
  }
  if (auStack_438 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_438,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  auStack_268 = (undefined1  [8])&secondaryMemorySizeString._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_268,"asyncify-ignore-indirect","");
  bVar18 = Pass::hasArgument(&this->super_Pass,(string *)auStack_268);
  if (auStack_268 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
    operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
  }
  auStack_268 = (undefined1  [8])&secondaryMemorySizeString._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_268,"asyncify-removelist","");
  auStack_438 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_438,"");
  Pass::getArgumentOrDefault
            ((string *)local_790,&this->super_Pass,(string *)auStack_268,(string *)auStack_438);
  if (auStack_438 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_438,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  if (auStack_268 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
    operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
  }
  if (removeListInput._M_dataplus._M_p == (pointer)0x0) {
    auStack_438 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_438,"asyncify-blacklist","");
    auStack_518 = (undefined1  [8])local_508;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_518,"");
    Pass::getArgumentOrDefault
              ((string *)auStack_268,&this->super_Pass,(string *)auStack_438,(string *)auStack_518);
    std::__cxx11::string::operator=((string *)local_790,(string *)auStack_268);
    if (auStack_268 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
      operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
    }
    if (auStack_518 != (undefined1  [8])local_508) {
      operator_delete((void *)auStack_518,(ulong)(local_508._0_8_ + 1));
    }
    if (auStack_438 != (undefined1  [8])psVar1) {
      operator_delete((void *)auStack_438,instrumentedFuncs._M_h._M_bucket_count + 1);
    }
  }
  read_possible_response_file((string *)auStack_438,(string *)local_790);
  String::trim((string *)auStack_268,(string *)auStack_438);
  local_688._M_p = (pointer)&prefix._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff978,",","");
  auStack_518 = (undefined1  [8])local_508;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_518,local_688._M_p,prefix._M_dataplus._M_p + local_688._M_p);
  String::Split::Split(&local_568,(string *)auStack_268,(NewLineOr *)auStack_518);
  if (auStack_518 != (undefined1  [8])local_508) {
    operator_delete((void *)auStack_518,(ulong)(local_508._0_8_ + 1));
  }
  if ((size_type *)local_688._M_p != &prefix._M_string_length) {
    operator_delete(local_688._M_p,prefix._M_string_length + 1);
  }
  if (auStack_268 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
    operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
  }
  if (auStack_438 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_438,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  local_688._M_p = (pointer)&prefix._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff978,"asyncify-addlist","");
  renamings._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_c38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,"");
  Pass::getArgumentOrDefault
            ((string *)auStack_518,&this->super_Pass,(string *)&stack0xfffffffffffff978,
             (string *)&renamings._M_t._M_impl.super__Rb_tree_header._M_node_count);
  read_possible_response_file((string *)auStack_438,(string *)auStack_518);
  String::trim((string *)auStack_268,(string *)auStack_438);
  auStack_88 = (undefined1  [8])&analysis_1.field_0x8;
  local_26c = iVar48;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_88,",","");
  onlyListInput.field_2._8_8_ = &local_740;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&onlyListInput.field_2 + 8),auStack_88,
             (undefined1 *)
             ((long)&((analysis_1.wasm)->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)auStack_88));
  String::Split::Split
            (&local_548,(string *)auStack_268,(NewLineOr *)((long)&onlyListInput.field_2 + 8));
  if ((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
       *)onlyListInput.field_2._8_8_ != &local_740) {
    operator_delete((void *)onlyListInput.field_2._8_8_,(ulong)(local_740._M_t._M_impl._0_8_ + 1));
  }
  psVar2 = &secondaryMemorySizeString._M_string_length;
  if (auStack_88 != (undefined1  [8])&analysis_1.field_0x8) {
    operator_delete((void *)auStack_88,analysis_1._8_8_ + 1);
  }
  if (auStack_268 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
  }
  if (auStack_438 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_438,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  if (auStack_518 != (undefined1  [8])local_508) {
    operator_delete((void *)auStack_518,(ulong)(local_508._0_8_ + 1));
  }
  if ((long *)renamings._M_t._M_impl.super__Rb_tree_header._M_node_count != local_c38) {
    operator_delete((void *)renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    local_c38[0] + 1);
  }
  if ((size_type *)local_688._M_p != &prefix._M_string_length) {
    operator_delete(local_688._M_p,prefix._M_string_length + 1);
  }
  auStack_268 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_268,"asyncify-onlylist","");
  auStack_438 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_438,"");
  Pass::getArgumentOrDefault
            ((string *)((long)&removeListInput.field_2 + 8),&this->super_Pass,(string *)auStack_268,
             (string *)auStack_438);
  if (auStack_438 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_438,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  if (auStack_268 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
  }
  if (onlyListInput._M_dataplus._M_p == (pointer)0x0) {
    auStack_438 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_438,"asyncify-whitelist","");
    auStack_518 = (undefined1  [8])local_508;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_518,"");
    Pass::getArgumentOrDefault
              ((string *)auStack_268,&this->super_Pass,(string *)auStack_438,(string *)auStack_518);
    std::__cxx11::string::operator=
              ((string *)(removeListInput.field_2._M_local_buf + 8),(string *)auStack_268);
    if (auStack_268 != (undefined1  [8])psVar2) {
      operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
    }
    if (auStack_518 != (undefined1  [8])local_508) {
      operator_delete((void *)auStack_518,(ulong)(local_508._0_8_ + 1));
    }
    if (auStack_438 != (undefined1  [8])psVar1) {
      operator_delete((void *)auStack_438,instrumentedFuncs._M_h._M_bucket_count + 1);
    }
  }
  read_possible_response_file((string *)auStack_438,(string *)((long)&removeListInput.field_2 + 8));
  String::trim((string *)auStack_268,(string *)auStack_438);
  local_688._M_p = (pointer)&prefix._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff978,",","");
  auStack_518 = (undefined1  [8])local_508;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_518,local_688._M_p,prefix._M_dataplus._M_p + local_688._M_p);
  String::Split::Split(&local_328,(string *)auStack_268,(NewLineOr *)auStack_518);
  if (auStack_518 != (undefined1  [8])local_508) {
    operator_delete((void *)auStack_518,(ulong)(local_508._0_8_ + 1));
  }
  if ((size_type *)local_688._M_p != &prefix._M_string_length) {
    operator_delete(local_688._M_p,prefix._M_string_length + 1);
  }
  if (auStack_268 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
  }
  if (auStack_438 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_438,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  auStack_268 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_268,"asyncify-asserts","");
  analysis_1._55_1_ = Pass::hasArgument(&this->super_Pass,(string *)auStack_268);
  if (auStack_268 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
  }
  auStack_268 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_268,"asyncify-verbose","");
  bVar19 = Pass::hasArgument(&this->super_Pass,(string *)auStack_268);
  local_d8 = (_Rb_tree_node_base *)CONCAT71(local_d8._1_7_,bVar19);
  if (auStack_268 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
  }
  auStack_268 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_268,"asyncify-relocatable","");
  analysis_1._54_1_ = Pass::hasArgument(&this->super_Pass,(string *)auStack_268);
  if (auStack_268 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
  }
  auStack_268 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_268,"asyncify-in-secondary-memory","");
  bVar19 = Pass::hasArgument(&this->super_Pass,(string *)auStack_268);
  if (auStack_268 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
  }
  auStack_268 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_268,"asyncify-propagate-addlist","");
  bVar20 = Pass::hasArgument(&this->super_Pass,(string *)auStack_268);
  local_528 = (PassRunner *)CONCAT71(local_528._1_7_,bVar20);
  if (auStack_268 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
  }
  if (bVar19) {
    auStack_438 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_438,"asyncify-secondary-memory-size","");
    auStack_518 = (undefined1  [8])local_508;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_518,"1","");
    Pass::getArgumentOrDefault
              ((string *)auStack_268,&this->super_Pass,(string *)auStack_438,(string *)auStack_518);
    if (auStack_518 != (undefined1  [8])local_508) {
      operator_delete((void *)auStack_518,(ulong)(local_508._0_8_ + 1));
    }
    if (auStack_438 != (undefined1  [8])psVar1) {
      operator_delete((void *)auStack_438,instrumentedFuncs._M_h._M_bucket_count + 1);
    }
    auVar44 = auStack_268;
    piVar23 = __errno_location();
    iVar48 = *piVar23;
    *piVar23 = 0;
    secondaryMemorySize.addr = strtol((char *)auVar44,(char **)auStack_438,10);
    if (auStack_438 == auVar44) {
      std::__throw_invalid_argument("stoi");
LAB_007c46c1:
      std::__throw_out_of_range("stoi");
    }
    if (((long)(int)secondaryMemorySize.addr != secondaryMemorySize.addr) || (*piVar23 == 0x22))
    goto LAB_007c46c1;
    if (*piVar23 == 0) {
      *piVar23 = iVar48;
    }
    sVar53 = (string_view)createSecondaryMemory(this,module,secondaryMemorySize);
    (this->asyncifyMemory).super_IString.str = sVar53;
    instrumentedFuncs._M_h._M_bucket_count = secondaryMemorySizeString._M_string_length;
    auVar44 = auStack_268;
    if (auStack_268 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
LAB_007c2281:
      operator_delete((void *)auVar44,instrumentedFuncs._M_h._M_bucket_count + 1);
    }
  }
  else {
    puVar24 = (module->memories).
              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (module->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)puVar3 - (long)puVar24) < 9) {
      if (puVar24 == puVar3) {
        sVar53 = IString::interned((IString *)0x1,(string_view)ZEXT816(0xdf9ff1),SUB81(puVar3,0));
        auStack_268 = (undefined1  [8])operator_new(0x58);
        *(undefined8 *)&((Function *)auStack_268)->profile = 0;
        (((Function *)auStack_268)->vars).
        super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        (((Function *)auStack_268)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
        (((Function *)auStack_268)->type).id = 0;
        ((_Prime_rehash_policy *)&(((Function *)auStack_268)->super_Importable).module)->
        _M_next_resize = 0;
        (((Function *)auStack_268)->super_Importable).base.super_IString.str._M_len = 0;
        *(size_type *)&(((Function *)auStack_268)->super_Importable).super_Named.hasExplicitName = 0
        ;
        *(undefined8 *)&(((Function *)auStack_268)->super_Importable).module = 0;
        (((Function *)auStack_268)->super_Importable).super_Named.name.super_IString.str = sVar53;
        (((Function *)auStack_268)->vars).
        super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x2;
        *(undefined8 *)&((Function *)auStack_268)->profile = 1;
        (((Function *)auStack_268)->type).id = 1;
        Module::addMemory(module,(unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                                 auStack_268);
        if (auStack_268 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_268,0x58);
        }
        puVar24 = (module->memories).
                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      pMVar25 = (puVar24->_M_t).
                super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      pcVar7 = (pMVar25->super_Importable).super_Named.name.super_IString.str._M_str;
      (this->asyncifyMemory).super_IString.str._M_len =
           *(size_t *)&(pMVar25->super_Importable).super_Named;
      (this->asyncifyMemory).super_IString.str._M_str = pcVar7;
    }
    else {
      auStack_268 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)auStack_268,"asyncify-memory","");
      auStack_518 = (undefined1  [8])local_508;
      std::__cxx11::string::_M_construct<char_const*>((string *)auStack_518,"memory","");
      defaultValue = (string *)auStack_518;
      Pass::getArgumentOrDefault
                ((string *)auStack_438,&this->super_Pass,(string *)auStack_268,defaultValue);
      if (auStack_518 != (undefined1  [8])local_508) {
        operator_delete((void *)auStack_518,(ulong)(local_508._0_8_ + 1));
      }
      if (auStack_268 != (undefined1  [8])psVar2) {
        operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
      }
      puVar4 = (module->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar42 = (module->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar42 != puVar4;
          puVar42 = puVar42 + 1) {
        pEVar5 = (puVar42->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        if ((pEVar5->kind == Memory) &&
           (sVar53._M_str = (char *)0x0, sVar53._M_len = (size_t)auStack_438,
           sVar53 = IString::interned((IString *)instrumentedFuncs._M_h._M_buckets,sVar53,
                                      SUB81(defaultValue,0)),
           (pEVar5->name).super_IString.str._M_str == sVar53._M_str)) {
          pEVar5 = (puVar42->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          pvVar41 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
          if ((pEVar5->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
              super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
              super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
              super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
              super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
              super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_index == '\0') {
            pvVar41 = &pEVar5->value;
          }
          pcVar7 = (pvVar41->super__Variant_base<wasm::Name,_wasm::HeapType>).
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage
                   .super_IString.str._M_str;
          (this->asyncifyMemory).super_IString.str._M_len =
               *(size_t *)
                &(pvVar41->super__Variant_base<wasm::Name,_wasm::HeapType>).
                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>;
          (this->asyncifyMemory).super_IString.str._M_str = pcVar7;
          break;
        }
      }
      if ((this->asyncifyMemory).super_IString.str._M_str == (char *)0x0) {
        Fatal::Fatal((Fatal *)auStack_268);
        Fatal::operator<<((Fatal *)auStack_268,
                          (char (*) [93])
                          "Please specify which of the multiple memories to use, with --pass-arg=asyncify-memory@memory"
                         );
        goto LAB_007c4a0e;
      }
      auVar44 = auStack_438;
      if (auStack_438 != (undefined1  [8])psVar1) goto LAB_007c2281;
    }
  }
  pMVar25 = Module::getMemory(module,(Name)(this->asyncifyMemory).super_IString.str);
  (this->pointerType).id = (ulong)((pMVar25->addressType).id == 3) | 2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&func_1,
           &local_568.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_b48 = local_568.needToHandleBracketingOperations;
  String::handleBracketingOperators((Split *)auStack_268,(Split *)&func_1);
  instrumentedFuncs._M_h._M_bucket_count =
       (size_type)
       local_568.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  instrumentedFuncs._M_h._M_buckets =
       (__buckets_ptr)
       local_568.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auStack_438 = (undefined1  [8])
                local_568.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_568.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)secondaryMemorySizeString._M_string_length;
  local_568.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_268;
  local_568.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)secondaryMemorySizeString._M_dataplus._M_p;
  auStack_268 = (undefined1  [8])0x0;
  secondaryMemorySizeString._M_dataplus._M_p = (pointer)0x0;
  secondaryMemorySizeString._M_string_length = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_438);
  local_568.needToHandleBracketingOperations =
       (bool)secondaryMemorySizeString.field_2._M_local_buf[0];
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&func_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b40.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,&local_548.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_b40.needToHandleBracketingOperations = local_548.needToHandleBracketingOperations;
  String::handleBracketingOperators((Split *)auStack_268,&local_b40);
  instrumentedFuncs._M_h._M_bucket_count =
       (size_type)
       local_548.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  instrumentedFuncs._M_h._M_buckets =
       (__buckets_ptr)
       local_548.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auStack_438 = (undefined1  [8])
                local_548.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_548.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)secondaryMemorySizeString._M_string_length;
  local_548.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_268;
  local_548.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)secondaryMemorySizeString._M_dataplus._M_p;
  auStack_268 = (undefined1  [8])0x0;
  secondaryMemorySizeString._M_dataplus._M_p = (pointer)0x0;
  secondaryMemorySizeString._M_string_length = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_438);
  local_548.needToHandleBracketingOperations =
       (bool)secondaryMemorySizeString.field_2._M_local_buf[0];
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b40.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b20.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,&local_328.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_b20.needToHandleBracketingOperations = local_328.needToHandleBracketingOperations;
  String::handleBracketingOperators((Split *)auStack_268,&local_b20);
  instrumentedFuncs._M_h._M_bucket_count =
       (size_type)
       local_328.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  instrumentedFuncs._M_h._M_buckets =
       (__buckets_ptr)
       local_328.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auStack_438 = (undefined1  [8])
                local_328.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_328.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)secondaryMemorySizeString._M_string_length;
  local_328.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_268;
  local_328.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)secondaryMemorySizeString._M_dataplus._M_p;
  auStack_268 = (undefined1  [8])0x0;
  secondaryMemorySizeString._M_dataplus._M_p = (pointer)0x0;
  secondaryMemorySizeString._M_string_length = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_438);
  local_328.needToHandleBracketingOperations =
       (bool)secondaryMemorySizeString.field_2._M_local_buf[0];
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b20.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  if ((local_328.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_328.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((local_568.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_568.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ||
      (local_548.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_548.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)))) {
    Fatal::Fatal((Fatal *)auStack_268);
    Fatal::operator<<((Fatal *)auStack_268,
                      (char (*) [80])
                      "It makes no sense to use both an asyncify only-list together with another list."
                     );
LAB_007c4a0e:
    Fatal::~Fatal((Fatal *)auStack_268);
  }
  analysis_1._52_1_ = !bVar18;
  local_5a8._M_nxt = (_Hash_node_base *)&analysis_1.field_0x35;
  local_590 = std::
              _Function_handler<bool_(wasm::Name,_wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:1693:33)>
              ::_M_invoke;
  local_598 = std::
              _Function_handler<bool_(wasm::Name,_wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:1693:33)>
              ::_M_manager;
  cStack_31 = (char)local_d8;
  local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_740._M_t._M_impl.super__Rb_tree_header._M_header;
  local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_740._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_708 = &p_Stack_6d8;
  local_700 = 1;
  local_6f8._M_nxt = (_Hash_node_base *)0x0;
  sStack_6f0 = 0;
  local_6e8 = 1.0;
  local_6e0 = 0;
  p_Stack_6d8 = (_Base_ptr)0x0;
  local_6d0 = &p_Stack_6a0;
  local_6c8 = 1;
  local_6c0._M_nxt = (_Hash_node_base *)0x0;
  sStack_6b8 = 0;
  local_6b0 = 1.0;
  local_6a8 = 0;
  p_Stack_6a0 = (_Base_ptr)0x0;
  local_688._M_p = (pointer)&prefix._M_string_length;
  auStack_268 = (undefined1  [8])0x1a;
  onlyListInput.field_2._8_8_ = module;
  local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_710 = (undefined1  [8])module;
  local_5a0 = local_b00;
  local_688._M_p =
       (pointer)std::__cxx11::string::_M_create
                          ((ulong *)&stack0xfffffffffffff978,(ulong)auStack_268);
  prefix._M_string_length = (size_type)auStack_268;
  builtin_strncpy((char *)((long)local_688._M_p + 10),"ake_call",8);
  builtin_strncpy((char *)((long)local_688._M_p + 0x12),"_global_",8);
  *(undefined8 *)local_688._M_p = 0x796669636e797361;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)local_688._M_p + 8))->_M_allocated_capacity = 0x61635f656b61665f;
  prefix._M_dataplus._M_p = (pointer)auStack_268;
  *(char *)((long)local_688._M_p + (long)auStack_268) = '\0';
  _auStack_518 = (_Any_data)ZEXT816(0);
  local_508._8_8_ =
       std::
       _Function_handler<void_(wasm::Function_*,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:414:15)>
       ::_M_invoke;
  local_508._0_8_ =
       std::
       _Function_handler<void_(wasm::Function_*,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:414:15)>
       ::_M_manager;
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
              *)auStack_268,(Module *)local_710,(Func *)auStack_518);
  if ((code *)local_508._0_8_ != (code *)0x0) {
    (*(code *)local_508._0_8_)(auStack_518,auStack_518,3);
  }
  auStack_438 = (undefined1  [8])&instrumentedFuncs._M_h._M_rehash_policy._M_next_resize;
  instrumentedFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  instrumentedFuncs._M_h._M_bucket_count = 0;
  instrumentedFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  instrumentedFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  instrumentedFuncs._M_h._M_rehash_policy._M_max_load_factor._0_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._1_7_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._0_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._1_2_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._3_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._4_4_ = 0;
  p_Var26 = (_Rb_tree_node_base *)
            CONCAT71(secondaryMemorySizeString.field_2._9_7_,
                     secondaryMemorySizeString.field_2._M_local_buf[8]);
  if (p_Var26 != (_Rb_tree_node_base *)&secondaryMemorySizeString._M_string_length) {
    do {
      for (p_Var35 = p_Var26[1]._M_right; p_Var35 != (_Base_ptr)0x0; p_Var35 = *(_Base_ptr *)p_Var35
          ) {
        auStack_88 = (undefined1  [8])p_Var35->_M_parent;
        renamings._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)auStack_438;
        std::
        _Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Type_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Type,true>>>>
                  ((_Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)auStack_438,auStack_88,
                   &renamings._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26);
    } while (p_Var26 != (_Rb_tree_node_base *)&secondaryMemorySizeString._M_string_length);
  }
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>_>
               *)&secondaryMemorySizeString);
  if (instrumentedFuncs._M_h._M_bucket_count != 0) {
    p_Var26 = (_Rb_tree_node_base *)instrumentedFuncs._M_h._M_bucket_count;
    do {
      renamings._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)p_Var26->_M_parent;
      auStack_88 = (undefined1  [8])renamings._M_t._M_impl.super__Rb_tree_header._M_node_count;
      wasm::Type::toString_abi_cxx11_((string *)auStack_518,(Type *)auStack_88);
      plVar27 = (long *)std::__cxx11::string::replace
                                  ((ulong)auStack_518,0,(char *)0x0,(ulong)local_688._M_p);
      pFVar36 = (Function *)(plVar27 + 2);
      if ((Function *)*plVar27 == pFVar36) {
        secondaryMemorySizeString._M_string_length =
             (pFVar36->super_Importable).super_Named.name.super_IString.str._M_len;
        secondaryMemorySizeString.field_2._M_allocated_capacity = plVar27[3];
        auStack_268 = (undefined1  [8])&secondaryMemorySizeString._M_string_length;
      }
      else {
        secondaryMemorySizeString._M_string_length =
             (pFVar36->super_Importable).super_Named.name.super_IString.str._M_len;
        auStack_268 = (undefined1  [8])*plVar27;
      }
      secondaryMemorySizeString._M_dataplus._M_p = (pointer)plVar27[1];
      *plVar27 = (long)pFVar36;
      plVar27[1] = 0;
      *(undefined1 *)(plVar27 + 2) = 0;
      if (auStack_518 != (undefined1  [8])local_508) {
        operator_delete((void *)auStack_518,(ulong)(local_508._0_8_ + 1));
      }
      s._M_str = (char *)0x0;
      s._M_len = (size_t)auStack_268;
      reuse = SUB81(pFVar36,0);
      sVar53 = IString::interned((IString *)secondaryMemorySizeString._M_dataplus._M_p,s,(bool)reuse
                                );
      psVar28 = (string_view *)
                std::__detail::
                _Map_base<wasm::Type,_std::pair<const_wasm::Type,_wasm::Name>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_wasm::Name>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_708,
                             (key_type *)&renamings._M_t._M_impl.super__Rb_tree_header._M_node_count
                            );
      *psVar28 = sVar53;
      s_00._M_str = (char *)0x0;
      s_00._M_len = (size_t)auStack_268;
      local_d8 = p_Var26;
      _auStack_518 = (_Any_data)
                     IString::interned((IString *)secondaryMemorySizeString._M_dataplus._M_p,s_00,
                                       (bool)reuse);
      pmVar29 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Type>,_std::allocator<std::pair<const_wasm::Name,_wasm::Type>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Type>,_std::allocator<std::pair<const_wasm::Name,_wasm::Type>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_6d0,(key_type *)auStack_518);
      pmVar29->id = renamings._M_t._M_impl.super__Rb_tree_header._M_node_count;
      s_01._M_str = (char *)0x0;
      s_01._M_len = (size_t)auStack_268;
      sVar53 = IString::interned((IString *)secondaryMemorySizeString._M_dataplus._M_p,s_01,
                                 SUB81(renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,0)
                                );
      sVar9 = renamings._M_t._M_impl.super__Rb_tree_header._M_node_count;
      pEVar30 = LiteralUtils::makeZero
                          ((Type)renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,module);
      psVar28 = (string_view *)operator_new(0x50);
      psVar28[4]._M_len = 0;
      psVar28[4]._M_str = (char *)0x0;
      psVar28[3]._M_len = 0;
      psVar28[3]._M_str = (char *)0x0;
      psVar28[2]._M_len = 0;
      psVar28[2]._M_str = (char *)0x0;
      psVar28[1]._M_len = 0;
      psVar28[1]._M_str = (char *)0x0;
      auStack_518 = (undefined1  [8])psVar28;
      *psVar28 = sVar53;
      psVar28[3]._M_str = (char *)sVar9;
      psVar28[4]._M_len = (size_t)pEVar30;
      *(undefined1 *)&psVar28[4]._M_str = 1;
      Module::addGlobal(module,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                               auStack_518);
      p_Var26 = local_d8;
      if (auStack_518 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_518,0x50);
      }
      if (auStack_268 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
        operator_delete((void *)auStack_268,secondaryMemorySizeString._M_string_length + 1);
      }
      p_Var26 = *(_Rb_tree_node_base **)p_Var26;
    } while (p_Var26 != (_Rb_tree_node_base *)0x0);
  }
  std::
  _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)auStack_438);
  if ((size_type *)local_688._M_p != &prefix._M_string_length) {
    operator_delete(local_688._M_p,prefix._M_string_length + 1);
  }
  local_698 = cStack_31;
  local_978.field_2._M_allocated_capacity._0_4_ = 0x6f6d6572;
  local_978.field_2._M_allocated_capacity._4_2_ = 0x6576;
  local_978._M_string_length = 6;
  local_978.field_2._M_local_buf[6] = '\0';
  local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
  anon_unknown_0::PatternMatcher::PatternMatcher
            ((PatternMatcher *)auStack_518,&local_978,module,&local_568);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._M_dataplus._M_p != &local_978.field_2) {
    operator_delete(local_978._M_dataplus._M_p,
                    CONCAT17(local_978.field_2._M_local_buf[7],
                             CONCAT16(local_978.field_2._M_local_buf[6],
                                      CONCAT24(local_978.field_2._M_allocated_capacity._4_2_,
                                               local_978.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_958.field_2._M_allocated_capacity._0_4_ = 0x646461;
  local_958._M_string_length = 3;
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  anon_unknown_0::PatternMatcher::PatternMatcher
            ((PatternMatcher *)&stack0xfffffffffffff978,&local_958,module,&local_548);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,
                    CONCAT44(local_958.field_2._M_allocated_capacity._4_4_,
                             local_958.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_938.field_2._M_allocated_capacity._0_4_ = 0x796c6e6f;
  local_938._M_string_length = 4;
  local_938.field_2._M_allocated_capacity._4_4_ =
       local_938.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
  anon_unknown_0::PatternMatcher::PatternMatcher
            ((PatternMatcher *)&renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_938,module,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_938._M_dataplus._M_p != &local_938.field_2) {
    operator_delete(local_938._M_dataplus._M_p,
                    CONCAT44(local_938.field_2._M_allocated_capacity._4_4_,
                             local_938.field_2._M_allocated_capacity._0_4_) + 1);
  }
  renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&renamings;
  renamings._M_t._M_impl._0_4_ = 0;
  renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  renamings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  puVar47 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (puVar47 != puVar6) {
    do {
      pFVar36 = (puVar47->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if ((pFVar36->super_Importable).module.super_IString.str._M_str ==
          (char *)wasm::(anonymous_namespace)::ASYNCIFY._8_8_) {
        pcVar7 = (pFVar36->super_Importable).base.super_IString.str._M_str;
        if (pcVar7 == (char *)wasm::(anonymous_namespace)::START_UNWIND._8_8_) {
          pmVar31 = std::
                    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                  *)local_c78,(key_type *)pFVar36);
          uVar49 = (undefined4)wasm::(anonymous_namespace)::ASYNCIFY_START_UNWIND;
          uVar50 = wasm::(anonymous_namespace)::ASYNCIFY_START_UNWIND._4_4_;
          uVar51 = (undefined4)DAT_010b1938;
          uVar52 = DAT_010b1938._4_4_;
        }
        else if (pcVar7 == (char *)wasm::(anonymous_namespace)::STOP_UNWIND._8_8_) {
          pmVar31 = std::
                    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                  *)local_c78,(key_type *)pFVar36);
          uVar49 = (undefined4)wasm::(anonymous_namespace)::ASYNCIFY_STOP_UNWIND;
          uVar50 = wasm::(anonymous_namespace)::ASYNCIFY_STOP_UNWIND._4_4_;
          uVar51 = (undefined4)DAT_010b1948;
          uVar52 = DAT_010b1948._4_4_;
        }
        else if (pcVar7 == (char *)wasm::(anonymous_namespace)::START_REWIND._8_8_) {
          pmVar31 = std::
                    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                  *)local_c78,(key_type *)pFVar36);
          uVar49 = (undefined4)wasm::(anonymous_namespace)::ASYNCIFY_START_REWIND;
          uVar50 = wasm::(anonymous_namespace)::ASYNCIFY_START_REWIND._4_4_;
          uVar51 = (undefined4)DAT_010b1958;
          uVar52 = DAT_010b1958._4_4_;
        }
        else {
          if (pcVar7 != (char *)wasm::(anonymous_namespace)::STOP_REWIND._8_8_) {
            Fatal::Fatal((Fatal *)auStack_268);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&secondaryMemorySizeString._M_string_length,
                       "call to unidenfied asyncify import: ",0x24);
            Fatal::operator<<((Fatal *)auStack_268,
                              &(((puVar47->_M_t).
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->
                               super_Importable).base);
            goto LAB_007c4a0e;
          }
          pmVar31 = std::
                    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                  *)local_c78,(key_type *)pFVar36);
          uVar49 = (undefined4)wasm::(anonymous_namespace)::ASYNCIFY_STOP_REWIND;
          uVar50 = wasm::(anonymous_namespace)::ASYNCIFY_STOP_REWIND._4_4_;
          uVar51 = (undefined4)DAT_010b1968;
          uVar52 = DAT_010b1968._4_4_;
        }
        *(undefined4 *)&(pmVar31->super_IString).str._M_len = uVar49;
        *(undefined4 *)((long)&(pmVar31->super_IString).str._M_len + 4) = uVar50;
        *(undefined4 *)&(pmVar31->super_IString).str._M_str = uVar51;
        *(undefined4 *)((long)&(pmVar31->super_IString).str._M_str + 4) = uVar52;
      }
      puVar47 = puVar47 + 1;
    } while (puVar47 != puVar6);
  }
  wasm::ModuleUtils::
  renameFunctions<std::map<wasm::Name,wasm::Name,std::less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>
            (module,(map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                     *)local_c78);
  local_7b8._M_nxt = (_Hash_node_base *)0x0;
  uStack_7b0 = 0;
  local_7a8 = (code *)0x0;
  pcStack_7a0 = (code *)0x0;
  local_7b8._M_nxt = (_Hash_node_base *)operator_new(0x20);
  (local_7b8._M_nxt)->_M_nxt = &local_5a8;
  local_7b8._M_nxt[1]._M_nxt = (_Hash_node_base *)&cStack_31;
  local_7b8._M_nxt[2]._M_nxt = (_Hash_node_base *)module;
  local_7b8._M_nxt[3]._M_nxt = (_Hash_node_base *)&analysis_1.field_0x34;
  local_2d8._M_unused._M_object = &local_7b8;
  pcStack_7a0 = std::
                _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:584:15)>
                ::_M_invoke;
  local_7a8 = std::
              _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:584:15)>
              ::_M_manager;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c0 = std::
              _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h:363:48)>
              ::_M_invoke;
  local_2c8 = std::
              _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h:363:48)>
              ::_M_manager;
  analysis_1._8_8_ = (ulong)(uint)analysis_1._12_4_ << 0x20;
  analysis_1._16_8_ = 0;
  analysis_1._24_8_ = &analysis_1.field_0x8;
  analysis_1._40_8_ = 0;
  puVar47 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2d8._8_8_ = module;
  local_c0 = module;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  auStack_88 = (undefined1  [8])module;
  analysis_1._32_8_ = analysis_1._24_8_;
  if (puVar47 != puVar6) {
    do {
      auStack_268 = (undefined1  [8])
                    (puVar47->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      std::
      map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
      ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                    *)&analysis_1,(key_type *)auStack_268);
      puVar47 = puVar47 + 1;
    } while (puVar47 != puVar6);
  }
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::
  function((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> *
           )&local_298,
           (function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> *
           )&local_2d8);
  plVar27 = *(long **)((long)auStack_88 + 0x18);
  plVar8 = *(long **)((long)auStack_88 + 0x20);
  if (plVar27 != plVar8) {
    do {
      pFVar36 = (Function *)*plVar27;
      if (((_Prime_rehash_policy *)&(pFVar36->super_Importable).module)->_M_next_resize != 0) {
        auStack_438 = (undefined1  [8])pFVar36;
        pmVar32 = std::
                  map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                  ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                                *)&analysis_1,(key_type *)auStack_438);
        auStack_268 = (undefined1  [8])pFVar36;
        if (local_288 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        (*local_280)(&local_298,auStack_268,pmVar32);
      }
      plVar27 = plVar27 + 1;
    } while (plVar27 != plVar8);
  }
  auVar44 = auStack_88;
  p_Var46 = &local_b8._M_t._M_impl.super__Rb_tree_header;
  auStack_438 = (undefined1  [8])&PTR__PassRunner_010714e0;
  instrumentedFuncs._M_h._M_buckets = (__buckets_ptr)auStack_88;
  instrumentedFuncs._M_h._M_bucket_count = (long)auStack_88 + 0x200;
  instrumentedFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  instrumentedFuncs._M_h._M_element_count._0_4_ = 0;
  instrumentedFuncs._M_h._M_element_count._4_4_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_max_load_factor._0_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._1_7_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._0_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._1_2_ = 0x101;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._4_4_ = 0;
  instrumentedFuncs._M_h._M_single_bucket._0_4_ = 0;
  instrumentedFuncs._M_h._M_single_bucket._4_4_ = 2;
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::
  function((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> *
           )&local_348,
           (function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> *
           )&local_298);
  wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::
  Info,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::
  Function*,wasm::(anonymous_namespace)::ModuleAnalyzer::Info&)>)::Mapper::Mapper(wasm::Module&,std
  ::map<wasm::Function*,wasm::(anonymous_namespace)::ModuleAnalyzer::Info,std::less<wasm::
  Function*>,std::allocator<std::pair<wasm::Function*const,wasm::(anonymous_namespace)::
  ModuleAnalyzer::Info>>>&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::
  ModuleAnalyzer::Info__>_(auStack_268,(Module *)auVar44,(Map *)&analysis_1,(Func *)&local_348);
  if (secondaryMemorySizeString._M_dataplus._M_p != auStack_438 &&
      secondaryMemorySizeString._M_dataplus._M_p != (pointer)0x0) {
    __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                  ,0x1dd,"void wasm::Pass::setPassRunner(PassRunner *)");
  }
  auVar44 = auStack_88;
  secondaryMemorySizeString._M_dataplus._M_p = auStack_438;
  (**(code **)((long)auStack_268 + 0x10))();
  auStack_268 = (undefined1  [8])&PTR__Mapper_010717e8;
  if (local_118 != (code *)0x0) {
    auVar44 = (undefined1  [8])&local_128;
    (*local_118)(auVar44,auVar44,3);
  }
  if (local_160 != (void *)0x0) {
    auVar44 = (undefined1  [8])(local_150 - (long)local_160);
    operator_delete(local_160,(ulong)auVar44);
  }
  Pass::~Pass((Pass *)auStack_268);
  if (local_338 != (code *)0x0) {
    auVar44 = (undefined1  [8])&local_348;
    (*local_338)((_Any_data *)auVar44,(_Any_data *)auVar44,__destroy_functor);
  }
  PassRunner::~PassRunner((PassRunner *)auStack_438);
  if (local_288 != (code *)0x0) {
    auVar44 = (undefined1  [8])&local_298;
    (*local_288)((_Any_data *)auVar44,(_Any_data *)auVar44,__destroy_functor);
  }
  if (local_2c8 != (code *)0x0) {
    auVar44 = (undefined1  [8])&local_2d8;
    (*local_2c8)(auVar44,auVar44,3);
  }
  uVar17 = analysis_1._32_8_;
  uVar16 = analysis_1._24_8_;
  uVar15 = analysis_1._16_8_;
  p_Var35 = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_690 = &PTR__PassRunner_010714e0;
  if (local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    if (analysis_1._16_8_ != 0) {
      local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = analysis_1._8_4_;
      *(_Rb_tree_header **)(analysis_1._16_8_ + 8) = p_Var46;
      p_Var40 = (_Rb_tree_header *)0x0;
      analysis_1._16_8_ = 0;
      p_Var35 = (_Base_ptr)&analysis_1.field_0x8;
      analysis_1._24_8_ = p_Var35;
      analysis_1._32_8_ = p_Var35;
      goto LAB_007c2ebc;
    }
LAB_007c2ec0:
    if ((_Rb_tree_header *)local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var46)
    {
      p_Var33 = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        p_Var26 = *(_Rb_tree_node_base **)(p_Var33 + 2);
        local_d8 = p_Var33;
        if (p_Var26 != (_Rb_tree_node_base *)&p_Var33[1]._M_left) {
          do {
            auStack_268 = *(undefined1 (*) [8])(p_Var26 + 1);
            pmVar32 = std::
                      map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                      ::operator[](&local_b8,(key_type *)auStack_268);
            auVar44 = (undefined1  [8])(p_Var33 + 1);
            std::
            _Rb_tree<wasm::Function*,wasm::Function*,std::_Identity<wasm::Function*>,std::less<wasm::Function*>,std::allocator<wasm::Function*>>
            ::_M_insert_unique<wasm::Function*const&>
                      ((_Rb_tree<wasm::Function*,wasm::Function*,std::_Identity<wasm::Function*>,std::less<wasm::Function*>,std::allocator<wasm::Function*>>
                        *)&(pmVar32->super_FunctionInfo).calledBy,(Function **)(p_Var33 + 1));
            p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26);
          } while (p_Var26 != (_Rb_tree_node_base *)&p_Var33[1]._M_left);
        }
        p_Var33 = (_Base_ptr)std::_Rb_tree_increment(local_d8);
      } while ((_Rb_tree_header *)p_Var33 != &local_b8._M_t._M_impl.super__Rb_tree_header);
    }
  }
  else {
    if (analysis_1._16_8_ != 0) {
      analysis_1._16_8_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      analysis_1._24_8_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      analysis_1._32_8_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      *(_Rb_tree_header **)(uVar15 + 8) = p_Var46;
      *(undefined1 **)
       &((_Rb_tree_header *)
        &(local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->_M_header =
           &analysis_1.field_0x8;
      p_Var35 = (_Base_ptr)analysis_1._40_8_;
      p_Var40 = (_Rb_tree_header *)local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count;
LAB_007c2ebc:
      local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count = analysis_1._40_8_;
      local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar17;
      local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)uVar15;
      local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)uVar16;
      analysis_1._40_8_ = p_Var40;
      goto LAB_007c2ec0;
    }
    analysis_1._8_4_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    analysis_1._16_8_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    analysis_1._24_8_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    analysis_1._32_8_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    *(undefined1 **)
     &((_Rb_tree_header *)
      &(local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->_M_header =
         &analysis_1.field_0x8;
    analysis_1._40_8_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var46->_M_header;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var46->_M_header;
  }
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
  ::_M_erase((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
              *)analysis_1._16_8_,(_Link_type)auVar44);
  if (local_7a8 != (code *)0x0) {
    (*local_7a8)(&local_7b8,&local_7b8,3);
  }
  if ((_Rb_tree_header *)local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_b8._M_t._M_impl.super__Rb_tree_header) {
    p_Var33 = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      bVar18 = anon_unknown_0::PatternMatcher::match
                         ((PatternMatcher *)auStack_518,(Name)(*(IString **)(p_Var33 + 1))->str);
      if (bVar18) {
        *(byte *)((long)&p_Var33[5]._M_color + 3) = 1;
        if ((cStack_31 == '\x01') && ((char)p_Var33[5]._M_color == _S_black)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[asyncify] ",0xb);
          name.super_IString.str._M_str = (char *)p_Var35;
          name.super_IString.str._M_len = (*(undefined8 **)(p_Var33 + 1))[1];
          poVar34 = wasm::operator<<((wasm *)&std::cout,(ostream *)**(undefined8 **)(p_Var33 + 1),
                                     name);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar34," is in the remove-list, ignore\n",0x1f);
        }
        *(undefined1 *)&p_Var33[5]._M_color = _S_red;
      }
      p_Var33 = (_Base_ptr)std::_Rb_tree_increment(p_Var33);
    } while ((_Rb_tree_header *)p_Var33 != &local_b8._M_t._M_impl.super__Rb_tree_header);
  }
  pNStack_2f8 = (pointer)0x0;
  funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var35 = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_b8._M_t._M_impl.super__Rb_tree_header) {
    do {
      __args = *(Name **)(p_Var35 + 1);
      sVar9 = __args[2].super_IString.str._M_len;
      if ((sVar9 != 0) && (sVar9 == wasm::(anonymous_namespace)::ASYNCIFY._8_8_)) {
        if (funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start ==
            funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)&pNStack_2f8,
                     (iterator)
                     funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                     _M_impl.super__Vector_impl_data._M_start,__args);
        }
        else {
          pcVar7 = (__args->super_IString).str._M_str;
          ((funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_len =
               (__args->super_IString).str._M_len;
          ((funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar7;
          funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start =
               funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
      auStack_268 = (undefined1  [8])0x0;
      secondaryMemorySizeString._M_dataplus._M_p = (pointer)0x0;
      secondaryMemorySizeString._M_string_length = 0;
      p_Var26 = *(_Rb_tree_node_base **)(p_Var35 + 2);
      if (p_Var26 != (_Rb_tree_node_base *)&p_Var35[1]._M_left) {
        do {
          auStack_438 = *(undefined1 (*) [8])(p_Var26 + 1);
          if ((*(undefined **)((long)auStack_438 + 0x20) != (undefined *)0x0) &&
             (*(undefined **)((long)auStack_438 + 0x20) ==
              (undefined *)wasm::(anonymous_namespace)::ASYNCIFY._8_8_)) {
            if (secondaryMemorySizeString._M_dataplus._M_p ==
                (pointer)secondaryMemorySizeString._M_string_length) {
              std::vector<wasm::Function*,std::allocator<wasm::Function*>>::
              _M_realloc_insert<wasm::Function*const&>
                        ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)auStack_268,
                         (iterator)secondaryMemorySizeString._M_dataplus._M_p,
                         (Function **)auStack_438);
            }
            else {
              *(undefined1 (*) [8])secondaryMemorySizeString._M_dataplus._M_p = auStack_438;
              secondaryMemorySizeString._M_dataplus._M_p =
                   secondaryMemorySizeString._M_dataplus._M_p + 8;
            }
          }
          p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26);
          _Var13 = secondaryMemorySizeString._M_dataplus;
          auVar44 = auStack_268;
        } while (p_Var26 != (_Rb_tree_node_base *)&p_Var35[1]._M_left);
        for (; auVar44 != (undefined1  [8])_Var13._M_p;
            auVar44 = (undefined1  [8])((long)auVar44 + 8)) {
          auStack_438 = *(undefined1 (*) [8])auVar44;
          pVar54 = std::
                   _Rb_tree<wasm::Function_*,_wasm::Function_*,_std::_Identity<wasm::Function_*>,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                   ::equal_range((_Rb_tree<wasm::Function_*,_wasm::Function_*,_std::_Identity<wasm::Function_*>,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                                  *)&p_Var35[1]._M_parent,(key_type *)auStack_438);
          std::
          _Rb_tree<wasm::Function_*,_wasm::Function_*,_std::_Identity<wasm::Function_*>,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
          ::_M_erase_aux((_Rb_tree<wasm::Function_*,_wasm::Function_*,_std::_Identity<wasm::Function_*>,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                          *)&p_Var35[1]._M_parent,(_Base_ptr)pVar54.first._M_node,
                         (_Base_ptr)pVar54.second._M_node);
        }
        if (auStack_268 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_268,
                          secondaryMemorySizeString._M_string_length - (long)auStack_268);
        }
      }
      p_Var35 = (_Base_ptr)std::_Rb_tree_increment(p_Var35);
      pNVar12 = funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start;
      pNVar43 = pNStack_2f8;
    } while ((_Rb_tree_header *)p_Var35 != &local_b8._M_t._M_impl.super__Rb_tree_header);
    for (; pNVar43 != pNVar12; pNVar43 = pNVar43 + 1) {
      Module::removeFunction(module,(Name)(pNVar43->super_IString).str);
    }
  }
  auStack_438 = (undefined1  [8])&local_548;
  instrumentedFuncs._M_h._M_bucket_count = (size_type)&stack0xfffffffffffff978;
  instrumentedFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)auStack_518;
  instrumentedFuncs._M_h._M_buckets = (__buckets_ptr)module;
  instrumentedFuncs._M_h._M_element_count = (size_type)&cStack_31;
  if ((char)local_528 != '\0') {
    anon_unknown_0::ModuleAnalyzer::ModuleAnalyzer::anon_class_40_5_a2539eac::operator()
              ((anon_class_40_5_a2539eac *)auStack_438,&local_b8);
  }
  local_2d8._8_8_ = auStack_588;
  auStack_588 = (undefined1  [8])0x0;
  loggings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  loggings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_88 = (undefined1  [8])0x0;
  analysis_1.wasm = (Module *)0x0;
  analysis_1._16_8_ =
       std::
       _Function_handler<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:722:27)>
       ::_M_invoke;
  analysis_1._8_8_ =
       std::
       _Function_handler<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:722:27)>
       ::_M_manager;
  local_348._M_unused._M_object = (void *)0x0;
  local_348._8_8_ = 0;
  local_330 = std::
              _Function_handler<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:723:27)>
              ::_M_invoke;
  local_338 = std::
              _Function_handler<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:723:27)>
              ::_M_manager;
  local_298._M_unused._M_object = (void *)0x0;
  local_298._8_8_ = 0;
  local_280 = std::
              _Function_handler<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:727:27)>
              ::_M_invoke;
  local_288 = std::
              _Function_handler<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:727:27)>
              ::_M_manager;
  local_2c0 = std::
              _Function_handler<void_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&,_wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:728:27)>
              ::_M_invoke;
  local_2c8 = std::
              _Function_handler<void_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&,_wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:728:27)>
              ::_M_manager;
  secondaryMemorySizeString.field_2._M_local_buf[8] = '\0';
  secondaryMemorySizeString.field_2._9_7_ = 0;
  secondaryMemorySizeString._M_string_length = 0;
  secondaryMemorySizeString.field_2._M_allocated_capacity = 0;
  auStack_268 = (undefined1  [8])0x0;
  secondaryMemorySizeString._M_dataplus._M_p = (pointer)0x0;
  item = (_Any_data *)0x0;
  local_2d8._M_unused._M_object = &cStack_31;
  std::_Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::_M_initialize_map
            ((_Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_268,0);
  auStack_218 = (undefined1  [8])&p_Stack_1e8;
  local_210 = true;
  uStack_20f = 0;
  local_208._M_value = (basic_ostream<char,_std::char_traits<char>_> *)0x0;
  uStack_200 = 0;
  local_1f8 = 1.0;
  local_1f0 = (__buckets_ptr)0x0;
  p_Stack_1e8 = (__node_base_ptr)0x0;
  puVar47 = (local_c0->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (local_c0->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar47 != puVar6) {
    do {
      local_2b8 = (undefined1  [8])
                  (puVar47->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      item = (_Any_data *)
             std::
             map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
             ::operator[](&local_b8,(key_type *)local_2b8);
      if (analysis_1._8_8_ == 0) {
        std::__throw_bad_function_call();
      }
      cVar21 = (*(code *)analysis_1._16_8_)(auStack_88);
      if (cVar21 != '\0') {
        local_2b8 = (undefined1  [8])
                    (puVar47->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        pmVar32 = std::
                  map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                  ::operator[](&local_b8,(key_type *)local_2b8);
        if (local_288 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        (*local_280)(&local_298,pmVar32);
        item = (_Any_data *)
               (puVar47->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        UniqueDeferredQueue<wasm::Function_*>::push
                  ((UniqueDeferredQueue<wasm::Function_*> *)auStack_268,(Function *)item);
      }
      puVar47 = puVar47 + 1;
    } while (puVar47 != puVar6);
  }
  while ((long)(CONCAT71(secondaryMemorySizeString.field_2._9_7_,
                         secondaryMemorySizeString.field_2._M_local_buf[8]) -
               secondaryMemorySizeString._M_string_length) >> 3 != 0) {
    pFVar36 = UniqueDeferredQueue<wasm::Function_*>::pop
                        ((UniqueDeferredQueue<wasm::Function_*> *)auStack_268);
    item = (_Any_data *)local_b68;
    local_b68 = (undefined1  [8])pFVar36;
    pmVar32 = std::
              map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
              ::operator[](&local_b8,(key_type *)item);
    p_Var26 = (pmVar32->super_FunctionInfo).calledBy._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    while ((_Rb_tree_header *)p_Var26 !=
           &(pmVar32->super_FunctionInfo).calledBy._M_t._M_impl.super__Rb_tree_header) {
      p_Var45 = *(_Any_data **)(p_Var26 + 1);
      local_300 = p_Var45;
      item = (_Any_data *)
             std::
             map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
             ::operator[](&local_b8,(key_type *)&local_300);
      if (local_338 == (code *)0x0) goto LAB_007c4622;
      cVar21 = (*local_330)(&local_348,(Function **)item,extraout_RDX);
      if (cVar21 != '\0') {
        pmVar37 = std::
                  map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                  ::operator[](&local_b8,(key_type *)&local_300);
        local_2b8 = (undefined1  [8])pFVar36;
        if (local_2c8 == (code *)0x0) {
LAB_007c4622:
          std::__throw_bad_function_call();
        }
        (*local_2c0)(&local_2d8,(Function **)pmVar37,(Info *)local_2b8);
        item = (_Any_data *)
               std::
               map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
               ::operator[](&local_b8,(key_type *)&local_300);
        if (analysis_1._8_8_ == 0) goto LAB_007c4622;
        cVar21 = (*(code *)analysis_1._16_8_)();
        if (cVar21 == '\0') {
          pmVar37 = std::
                    map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                    ::operator[](&local_b8,(key_type *)&local_300);
          if (local_288 == (code *)0x0) goto LAB_007c4622;
          (*local_280)(&local_298,pmVar37);
          UniqueDeferredQueue<wasm::Function_*>::push
                    ((UniqueDeferredQueue<wasm::Function_*> *)auStack_268,(Function *)p_Var45);
          item = p_Var45;
        }
      }
      p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26);
    }
  }
  std::
  _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)auStack_218);
  std::_Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~_Deque_base
            ((_Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_268);
  p_Var46 = &local_b8._M_t._M_impl.super__Rb_tree_header;
  if (local_2c8 != (code *)0x0) {
    item = &local_2d8;
    (*local_2c8)(item,item,3);
  }
  if (local_288 != (code *)0x0) {
    item = &local_298;
    (*local_288)(item,item,__destroy_functor);
  }
  if (local_338 != (code *)0x0) {
    item = &local_348;
    (*local_338)(item,item,__destroy_functor);
  }
  if (analysis_1._8_8_ != 0) {
    item = (_Any_data *)auStack_88;
    (*(code *)analysis_1._8_8_)(item,item,3);
  }
  p_Var45 = (_Any_data *)
            loggings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar44 = auStack_588;
  if (auStack_588 !=
      (undefined1  [8])
      loggings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar38 = (long)loggings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_588 >> 5;
    lVar10 = 0x3f;
    if (uVar38 != 0) {
      for (; uVar38 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (auStack_588,
               loggings.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar44);
    pbVar11 = loggings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    item = p_Var45;
    for (auVar44 = auStack_588; auVar44 != (undefined1  [8])pbVar11;
        auVar44 = (undefined1  [8])((long)auVar44 + 0x20)) {
      item = (_Any_data *)(((pointer)auVar44)->_M_dataplus)._M_p;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,item->_M_pod_data,((pointer)auVar44)->_M_string_length);
    }
  }
  p_Var14 = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  p_Var33 = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var35 = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    p_Var40 = (_Rb_tree_header *)0x0;
    if (local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
    goto LAB_007c3768;
    local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    p_Var40 = &local_740._M_t._M_impl.super__Rb_tree_header;
    *(_Rb_tree_header **)
     &((_Rb_tree_header *)
      &(local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->_M_header =
         p_Var40;
    p_Var39 = (_Rb_tree_header *)0x0;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var46->_M_header;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var46->_M_header;
  }
  else {
    if (local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      *(_Rb_tree_header **)
       &((_Rb_tree_header *)
        &(local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->_M_header =
           p_Var46;
      local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_740._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      p_Var40 = &local_740._M_t._M_impl.super__Rb_tree_header;
      local_740._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var40->_M_header;
      local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var40->_M_header;
      goto LAB_007c3768;
    }
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    *(_Rb_tree_header **)&((_Rb_tree_header *)&p_Var35->_M_parent)->_M_header =
         &local_740._M_t._M_impl.super__Rb_tree_header;
    *(_Rb_tree_header **)
     &((_Rb_tree_header *)
      &(local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->_M_header =
         p_Var46;
    p_Var39 = (_Rb_tree_header *)local_740._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var40 = (_Rb_tree_header *)local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  }
  local_740._M_t._M_impl.super__Rb_tree_header._M_node_count =
       local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var14;
  local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var33;
  local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var35;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)p_Var39;
LAB_007c3768:
  if (local_328.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_328.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar47 = (module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar47 != puVar6) {
      do {
        pFVar36 = (puVar47->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if ((pFVar36->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          auStack_268 = (undefined1  [8])pFVar36;
          pmVar32 = std::
                    map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                    ::operator[](&local_740,(key_type *)auStack_268);
          pFVar36 = (puVar47->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          item = *(_Any_data **)&(pFVar36->super_Importable).super_Named;
          bVar18 = anon_unknown_0::PatternMatcher::match
                             ((PatternMatcher *)
                              &renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (IString)*(IString *)&(pFVar36->super_Importable).super_Named);
          pmVar32->canChangeState = bVar18;
          if (bVar18) {
            pmVar32->addedFromList = true;
          }
          if (cStack_31 == '\x01') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[asyncify] ",0xb);
            pFVar36 = (puVar47->_M_t).
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            name_00.super_IString.str._M_str = (char *)p_Var40;
            name_00.super_IString.str._M_len =
                 (size_t)(pFVar36->super_Importable).super_Named.name.super_IString.str._M_str;
            poVar34 = wasm::operator<<((wasm *)&std::cout,
                                       *(ostream **)&(pFVar36->super_Importable).super_Named,name_00
                                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar34,"\'s state is set based on the only-list to ",0x2a);
            poVar34 = std::ostream::_M_insert<bool>(SUB81(poVar34,0));
            auStack_268[0] = 10;
            item = (_Any_data *)auStack_268;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar34,((_Any_data *)auStack_268)->_M_pod_data,1);
          }
        }
        puVar47 = puVar47 + 1;
      } while (puVar47 != puVar6);
    }
  }
  if ((char)local_528 == '\0') {
    item = (_Any_data *)&local_740;
    anon_unknown_0::ModuleAnalyzer::ModuleAnalyzer::anon_class_40_5_a2539eac::operator()
              ((anon_class_40_5_a2539eac *)auStack_438,(Map *)item);
  }
  anon_unknown_0::PatternMatcher::checkPatternsMatches((PatternMatcher *)auStack_518);
  anon_unknown_0::PatternMatcher::checkPatternsMatches((PatternMatcher *)&stack0xfffffffffffff978);
  anon_unknown_0::PatternMatcher::checkPatternsMatches
            ((PatternMatcher *)&renamings._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_588);
  if (pNStack_2f8 != (pointer)0x0) {
    item = (_Any_data *)
           ((long)funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pNStack_2f8);
    operator_delete(pNStack_2f8,(ulong)item);
  }
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
  ::_M_erase((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
              *)local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,(_Link_type)item);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)local_c78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_bc8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_bf8);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_c28);
  if ((long *)renamings._M_t._M_impl.super__Rb_tree_header._M_node_count != local_c38) {
    operator_delete((void *)renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    local_c38[0] + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&stack0xfffffffffffffa28);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffff9f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffff9c8);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)((long)&prefix.field_2 + 8));
  if ((size_type *)local_688._M_p != &prefix._M_string_length) {
    operator_delete(local_688._M_p,prefix._M_string_length + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_468);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_498);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_4c8);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_4f8);
  if (auStack_518 != (undefined1  [8])local_508) {
    operator_delete((void *)auStack_518,(ulong)(local_508._0_8_ + 1));
  }
  if (local_598 != (code *)0x0) {
    (*local_598)(&local_5a8,&local_5a8,3);
  }
  addGlobals(this,module,(bool)analysis_1._54_1_);
  auStack_438 = (undefined1  [8])&instrumentedFuncs._M_h._M_rehash_policy._M_next_resize;
  instrumentedFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  instrumentedFuncs._M_h._M_bucket_count = 0;
  instrumentedFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  instrumentedFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  instrumentedFuncs._M_h._M_rehash_policy._M_max_load_factor._0_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._1_7_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._0_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._1_2_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._3_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._4_4_ = 0;
  puVar47 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar47 != puVar6) {
    do {
      auStack_268 = (undefined1  [8])
                    (puVar47->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pmVar32 = std::
                map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                ::operator[](&local_740,(key_type *)auStack_268);
      if ((pmVar32->canChangeState == true) && ((pmVar32->isTopMostRuntime & 1U) == 0)) {
        auStack_518 = (undefined1  [8])
                      (puVar47->_M_t).
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        auStack_268 = (undefined1  [8])auStack_438;
        std::
        _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<wasm::Function*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                  ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)auStack_268,auStack_518,auStack_268);
      }
      puVar47 = puVar47 + 1;
    } while (puVar47 != puVar6);
  }
  secondaryMemorySizeString._M_string_length = (size_type)&module->allocator;
  secondaryMemorySizeString.field_2._M_allocated_capacity = 0;
  secondaryMemorySizeString.field_2._M_local_buf[8] = '\0';
  secondaryMemorySizeString.field_2._9_7_ = 0;
  uStack_200 = uStack_200 & 0xffffffffffffff00;
  local_1f8 = (float)((uint)local_1f8 & 0xffffff00);
  auStack_218[0] = false;
  auStack_218[1] = false;
  auStack_218[2] = false;
  auStack_218[3] = false;
  auStack_218[4] = false;
  auStack_218[5] = false;
  auStack_218[6] = false;
  auStack_218[7] = false;
  local_210 = false;
  p_Stack_1e8 = (__node_base_ptr)0x1;
  local_1e0._M_nxt = (_Hash_node_base *)0x0;
  sStack_1d8 = 0;
  local_1d0 = 1.0;
  local_1c8 = 0;
  p_Stack_1c0 = (__node_base_ptr)0x0;
  local_1b0 = 1;
  local_1a8._M_nxt = (_Hash_node_base *)0x0;
  sStack_1a0 = 0;
  local_198 = 1.0;
  local_190 = 0;
  p_Stack_188 = (__node_base_ptr)0x0;
  local_180 = 0;
  auStack_268 = (undefined1  [8])&PTR__PassRunner_01071968;
  local_178 = auStack_438;
  stateChangingImports.field_2._8_8_ = &stack0xfffffffffffff738;
  secondaryMemorySizeString._M_dataplus._M_p = (pointer)module;
  local_1f0 = &p_Stack_1c0;
  local_1b8 = &p_Stack_188;
  local_d8 = (_Rb_tree_node_base *)secondaryMemorySizeString._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&stateChangingImports.field_2 + 8),"flatten","");
  local_ac0 = '\0';
  PassRunner::add((PassRunner *)auStack_268,(string *)((long)&stateChangingImports.field_2 + 8),
                  (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&listedImports.needToHandleBracketingOperations);
  if ((local_ac0 == '\x01') && (local_ac0 = '\0', (long *)listedImports._24_8_ != local_ad0)) {
    operator_delete((void *)listedImports._24_8_,local_ad0[0] + 1);
  }
  if ((long *)stateChangingImports.field_2._8_8_ != &stack0xfffffffffffff738) {
    operator_delete((void *)stateChangingImports.field_2._8_8_,local_8c8 + 1);
  }
  local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,"dce","");
  local_a98 = false;
  PassRunner::add((PassRunner *)auStack_268,&local_8b8,
                  (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_ab8);
  if ((local_a98 == true) &&
     (local_a98 = false,
     local_ab8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_ab8._M_value + 0x10))) {
    operator_delete((void *)local_ab8._M_value._M_dataplus._M_p,local_ab8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
    operator_delete(local_8b8._M_dataplus._M_p,local_8b8.field_2._M_allocated_capacity + 1);
  }
  iVar48 = local_26c;
  if (0 < local_26c) {
    local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"remove-unused-names","");
    local_a70 = false;
    PassRunner::add((PassRunner *)auStack_268,&local_898,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a90);
    if ((local_a70 == true) &&
       (local_a70 = false,
       local_a90._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a90._M_value + 0x10))) {
      operator_delete((void *)local_a90._M_value._M_dataplus._M_p,local_a90._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_898._M_dataplus._M_p != &local_898.field_2) {
      operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
    }
    local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_878,"simplify-locals-nonesting","");
    local_a48 = false;
    PassRunner::add((PassRunner *)auStack_268,&local_878,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a68);
    if ((local_a48 == true) &&
       (local_a48 = false,
       local_a68._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a68._M_value + 0x10))) {
      operator_delete((void *)local_a68._M_value._M_dataplus._M_p,local_a68._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_878._M_dataplus._M_p != &local_878.field_2) {
      operator_delete(local_878._M_dataplus._M_p,local_878.field_2._M_allocated_capacity + 1);
    }
    local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"reorder-locals","");
    local_a20 = false;
    PassRunner::add((PassRunner *)auStack_268,&local_858,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a40);
    if ((local_a20 == true) &&
       (local_a20 = false,
       local_a40._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a40._M_value + 0x10))) {
      operator_delete((void *)local_a40._M_value._M_dataplus._M_p,local_a40._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_858._M_dataplus._M_p != &local_858.field_2) {
      operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
    }
    local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"coalesce-locals","");
    local_9f8 = false;
    PassRunner::add((PassRunner *)auStack_268,&local_838,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a18);
    if ((local_9f8 == true) &&
       (local_9f8 = false,
       local_a18._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a18._M_value + 0x10))) {
      operator_delete((void *)local_a18._M_value._M_dataplus._M_p,local_a18._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_838._M_dataplus._M_p != &local_838.field_2) {
      operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
    }
    local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_818,"simplify-locals-nonesting","");
    local_9d0 = false;
    PassRunner::add((PassRunner *)auStack_268,&local_818,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9f0);
    if ((local_9d0 == true) &&
       (local_9d0 = false,
       local_9f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_9f0._M_value + 0x10))) {
      operator_delete((void *)local_9f0._M_value._M_dataplus._M_p,local_9f0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_818._M_dataplus._M_p != &local_818.field_2) {
      operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
    }
    local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"reorder-locals","");
    local_9a8 = false;
    PassRunner::add((PassRunner *)auStack_268,&local_7f8,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9c8);
    if ((local_9a8 == true) &&
       (local_9a8 = false,
       local_9c8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_9c8._M_value + 0x10))) {
      operator_delete((void *)local_9c8._M_value._M_dataplus._M_p,local_9c8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
      operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
    }
    local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"merge-blocks","");
    local_980 = false;
    PassRunner::add((PassRunner *)auStack_268,&local_7d8,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9a0);
    if ((local_980 == true) &&
       (local_980 = false,
       local_9a0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_9a0._M_value + 0x10))) {
      operator_delete((void *)local_9a0._M_value._M_dataplus._M_p,local_9a0._16_8_ + 1);
    }
    iVar48 = local_26c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
      operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
    }
  }
  local_528 = (PassRunner *)(this->pointerType).id;
  pcStack_520 = (pointer)(this->asyncifyMemory).super_IString.str._M_len;
  pcVar7 = (this->asyncifyMemory).super_IString.str._M_str;
  local_2b0._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
  super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
       (tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_>)operator_new(0x98);
  *(long *)((long)local_2b0._M_t.
                  super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                  super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 8) = 0;
  *(long **)((long)local_2b0._M_t.
                   super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x10) =
       (long *)((long)local_2b0._M_t.
                      super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                      super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x20);
  *(long *)((long)local_2b0._M_t.
                  super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                  super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined1 *)
   ((long)local_2b0._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
          super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined1 *)
   ((long)local_2b0._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
          super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined ***)
   local_2b0._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl = &PTR__AsyncifyFlow_01071848;
  *(undefined1 **)
   ((long)local_2b0._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
          super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x58) =
       (undefined1 *)((long)&onlyListInput.field_2 + 8);
  *(PassRunner **)
   ((long)local_2b0._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
          super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x60) = local_528;
  *(pointer *)
   ((long)local_2b0._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
          super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x68) = pcStack_520;
  *(char **)((long)local_2b0._M_t.
                   super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x70) = pcVar7;
  *(long *)((long)local_2b0._M_t.
                  super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                  super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x78) = 0;
  *(undefined4 *)
   ((long)local_2b0._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
          super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x90) = 0;
  PassRunner::add((PassRunner *)auStack_268,
                  (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_2b0);
  if ((_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
      local_2b0._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
      super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl != (Pass *)0x0) {
    (**(code **)(*(long *)local_2b0._M_t.
                          super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                          super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 8))();
  }
  local_2b0._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
  super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
       (tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
       (_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)0x0;
  local_180._0_1_ = true;
  PassRunner::run((PassRunner *)auStack_268);
  PassRunner::~PassRunner((PassRunner *)auStack_268);
  if (analysis_1._55_1_ != '\0') {
    auStack_268 = (undefined1  [8])local_690;
    secondaryMemorySizeString._M_string_length = (size_type)local_d8;
    secondaryMemorySizeString.field_2._M_allocated_capacity = 0;
    secondaryMemorySizeString.field_2._M_local_buf[8] = '\0';
    secondaryMemorySizeString.field_2._9_7_ = 0;
    uStack_200 = uStack_200 & 0xffffffffffffff00;
    local_1f8 = (float)((uint)local_1f8 & 0xffffff00);
    auStack_218[0] = false;
    auStack_218[1] = false;
    auStack_218[2] = false;
    auStack_218[3] = false;
    auStack_218[4] = false;
    auStack_218[5] = false;
    auStack_218[6] = false;
    auStack_218[7] = false;
    local_210 = false;
    p_Stack_1e8 = (__node_base_ptr)0x1;
    local_1e0._M_nxt = (_Hash_node_base *)0x0;
    sStack_1d8 = 0;
    local_1d0 = 1.0;
    local_1c8 = 0;
    p_Stack_1c0 = (__node_base_ptr)0x0;
    local_1b0 = 1;
    local_1a8._M_nxt = (_Hash_node_base *)0x0;
    sStack_1a0 = 0;
    local_198 = 1.0;
    local_190 = 0;
    p_Stack_188 = (__node_base_ptr)0x0;
    local_180 = 0;
    local_528 = (PassRunner *)(this->pointerType).id;
    pcStack_520 = (pointer)(this->asyncifyMemory).super_IString.str._M_len;
    pcVar7 = (this->asyncifyMemory).super_IString.str._M_str;
    secondaryMemorySizeString._M_dataplus._M_p = (pointer)module;
    local_1f0 = &p_Stack_1c0;
    local_1b8 = &p_Stack_188;
    local_2a8._M_head_impl = (Pass *)operator_new(0x88);
    (local_2a8._M_head_impl)->runner = (PassRunner *)0x0;
    ((local_2a8._M_head_impl)->name)._M_dataplus._M_p =
         (pointer)&((local_2a8._M_head_impl)->name).field_2;
    ((local_2a8._M_head_impl)->name)._M_string_length = 0;
    ((local_2a8._M_head_impl)->name).field_2._M_local_buf[0] = '\0';
    ((local_2a8._M_head_impl)->passArg).
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    (local_2a8._M_head_impl)->_vptr_Pass =
         (_func_int **)&PTR__AsyncifyAssertInNonInstrumented_010718a8;
    local_2a8._M_head_impl[1]._vptr_Pass = (_func_int **)((long)&onlyListInput.field_2 + 8);
    local_2a8._M_head_impl[1].runner = local_528;
    local_2a8._M_head_impl[1].name._M_dataplus._M_p = pcStack_520;
    local_2a8._M_head_impl[1].name._M_string_length = (size_type)pcVar7;
    local_2a8._M_head_impl[1].name.field_2._M_allocated_capacity = 0;
    PassRunner::add((PassRunner *)auStack_268,
                    (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_2a8);
    if (local_2a8._M_head_impl != (Pass *)0x0) {
      (*(local_2a8._M_head_impl)->_vptr_Pass[1])();
    }
    local_2a8._M_head_impl = (Pass *)0x0;
    local_180._0_1_ = true;
    PassRunner::run((PassRunner *)auStack_268);
    PassRunner::~PassRunner((PassRunner *)auStack_268);
  }
  secondaryMemorySizeString._M_string_length = (size_type)local_d8;
  secondaryMemorySizeString.field_2._M_allocated_capacity = 0;
  secondaryMemorySizeString.field_2._M_local_buf[8] = '\0';
  secondaryMemorySizeString.field_2._9_7_ = 0;
  uStack_200 = uStack_200 & 0xffffffffffffff00;
  local_1f8 = (float)((uint)local_1f8 & 0xffffff00);
  auStack_218[0] = false;
  auStack_218[1] = false;
  auStack_218[2] = false;
  auStack_218[3] = false;
  auStack_218[4] = false;
  auStack_218[5] = false;
  auStack_218[6] = false;
  auStack_218[7] = false;
  local_210 = false;
  p_Stack_1e8 = (__node_base_ptr)0x1;
  local_1e0._M_nxt = (_Hash_node_base *)0x0;
  sStack_1d8 = 0;
  local_1d0 = 1.0;
  local_1c8 = 0;
  p_Stack_1c0 = (__node_base_ptr)0x0;
  local_1b0 = 1;
  local_1a8._M_nxt = (_Hash_node_base *)0x0;
  sStack_1a0 = 0;
  local_198 = 1.0;
  local_190 = 0;
  p_Stack_188 = (__node_base_ptr)0x0;
  local_180 = 0;
  auStack_268 = (undefined1  [8])&PTR__PassRunner_01071968;
  local_178 = auStack_438;
  secondaryMemorySizeString._M_dataplus._M_p = (pointer)module;
  local_1f0 = &p_Stack_1c0;
  local_1b8 = &p_Stack_188;
  if (0 < iVar48) {
    PassRunner::addDefaultFunctionOptimizationPasses((PassRunner *)auStack_268);
  }
  local_d8 = (_Rb_tree_node_base *)(this->pointerType).id;
  sStack_d0 = (this->asyncifyMemory).super_IString.str._M_len;
  p_Var35 = (_Base_ptr)(this->asyncifyMemory).super_IString.str._M_str;
  local_2a0._M_nxt = (_Hash_node_base *)operator_new(0x1c8);
  ((_Base_ptr)local_2a0._M_nxt)->_M_parent = (_Base_ptr)0x0;
  ((_Base_ptr)local_2a0._M_nxt)->_M_left = (_Base_ptr)((long)local_2a0._M_nxt + 0x20);
  ((_Base_ptr)local_2a0._M_nxt)->_M_right = (_Base_ptr)0x0;
  *(undefined1 *)&((_Base_ptr)((long)local_2a0._M_nxt + 0x20))->_M_color = _S_red;
  *(undefined1 *)&((_Base_ptr)((long)local_2a0._M_nxt + 0x40))->_M_left = 0;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x40))->_M_right = (_Base_ptr)0x0;
  *(undefined8 *)&((_Base_ptr)((long)local_2a0._M_nxt + 0x60))->_M_color = 0;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x100))->_M_parent = (_Base_ptr)0x0;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x100))->_M_left = (_Base_ptr)0x0;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x100))->_M_right = (_Base_ptr)0x0;
  *(undefined8 *)&((_Base_ptr)((long)local_2a0._M_nxt + 0x120))->_M_color = 0;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x120))->_M_parent = (_Base_ptr)0x0;
  *(undefined ***)&((_Base_ptr)local_2a0._M_nxt)->_M_color = &PTR__AsyncifyLocals_01071908;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x120))->_M_left =
       (_Base_ptr)((long)&onlyListInput.field_2 + 8);
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x120))->_M_right = local_d8;
  *(size_t *)&((_Base_ptr)((long)local_2a0._M_nxt + 0x140))->_M_color = sStack_d0;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x140))->_M_parent = p_Var35;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x140))->_M_left = (_Base_ptr)0x0;
  *(_Base_ptr **)&((_Base_ptr)((long)local_2a0._M_nxt + 0x160))->_M_color =
       &((_Base_ptr)((long)local_2a0._M_nxt + 0x180))->_M_left;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x160))->_M_parent = (_Base_ptr)0x1;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x160))->_M_left = (_Base_ptr)0x0;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x160))->_M_right = (_Base_ptr)0x0;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x180))->_M_color = 0x3f800000;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x180))->_M_parent = (_Base_ptr)0x0;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x180))->_M_left = (_Base_ptr)0x0;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x1a0))->_M_color = _S_red;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x1a0))->_M_parent = (_Base_ptr)0x0;
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x1a0))->_M_left =
       (_Base_ptr)((long)local_2a0._M_nxt + 0x1a0);
  ((_Base_ptr)((long)local_2a0._M_nxt + 0x1a0))->_M_right =
       (_Base_ptr)((long)local_2a0._M_nxt + 0x1a0);
  *(undefined8 *)&((_Base_ptr)((long)local_2a0._M_nxt + 0x1c0))->_M_color = 0;
  PassRunner::add((PassRunner *)auStack_268,
                  (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_2a0);
  if ((_Base_ptr)local_2a0._M_nxt != (_Base_ptr)0x0) {
    (*(code *)(local_2a0._M_nxt)->_M_nxt[1]._M_nxt)();
  }
  local_2a0._M_nxt = (_Hash_node_base *)0x0;
  if (0 < iVar48) {
    PassRunner::addDefaultFunctionOptimizationPasses((PassRunner *)auStack_268);
  }
  local_180._0_1_ = true;
  PassRunner::run((PassRunner *)auStack_268);
  PassRunner::~PassRunner((PassRunner *)auStack_268);
  addFunctions(this,module);
  std::
  _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)auStack_438);
  anon_unknown_0::FakeGlobalHelper::~FakeGlobalHelper((FakeGlobalHelper *)local_710);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
  ::_M_erase((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
              *)local_740._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,(_Link_type)module)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  if ((size_type *)removeListInput.field_2._8_8_ != &onlyListInput._M_string_length) {
    operator_delete((void *)removeListInput.field_2._8_8_,onlyListInput._M_string_length + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_548.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_568.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  if (local_790 != (undefined1  [8])&removeListInput._M_string_length) {
    operator_delete((void *)local_790,removeListInput._M_string_length + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b00);
  if (local_918 != (undefined1  [8])&ignoreImports._M_string_length) {
    operator_delete((void *)local_918,ignoreImports._M_string_length + 1);
  }
  if ((size_type *)ignoreImports.field_2._8_8_ != &stateChangingImports._M_string_length) {
    operator_delete((void *)ignoreImports.field_2._8_8_,stateChangingImports._M_string_length + 1);
  }
  return;
}

Assistant:

void run(Module* module) override {
    bool optimize = getPassOptions().optimizeLevel > 0;

    // Find which things can change the state.
    auto stateChangingImports = String::trim(read_possible_response_file(
      getArgumentOrDefault("asyncify-imports", "")));
    auto ignoreImports = getArgumentOrDefault("asyncify-ignore-imports", "");
    bool allImportsCanChangeState =
      stateChangingImports == "" && ignoreImports == "";
    String::Split listedImports(stateChangingImports,
                                String::Split::NewLineOr(","));
    // canIndirectChangeState is the default.  asyncify-ignore-indirect sets it
    // to false.
    auto canIndirectChangeState = !hasArgument("asyncify-ignore-indirect");
    std::string removeListInput =
      getArgumentOrDefault("asyncify-removelist", "");
    if (removeListInput.empty()) {
      // Support old name for now to avoid immediate breakage TODO remove
      removeListInput = getArgumentOrDefault("asyncify-blacklist", "");
    }
    String::Split removeList(
      String::trim(read_possible_response_file(removeListInput)),
      String::Split::NewLineOr(","));
    String::Split addList(String::trim(read_possible_response_file(
                            getArgumentOrDefault("asyncify-addlist", ""))),
                          String::Split::NewLineOr(","));
    std::string onlyListInput = getArgumentOrDefault("asyncify-onlylist", "");
    if (onlyListInput.empty()) {
      // Support old name for now to avoid immediate breakage TODO remove
      onlyListInput = getArgumentOrDefault("asyncify-whitelist", "");
    }
    String::Split onlyList(
      String::trim(read_possible_response_file(onlyListInput)),
      String::Split::NewLineOr(","));
    auto asserts = hasArgument("asyncify-asserts");
    auto verbose = hasArgument("asyncify-verbose");
    auto relocatable = hasArgument("asyncify-relocatable");
    auto secondaryMemory = hasArgument("asyncify-in-secondary-memory");
    auto propagateAddList = hasArgument("asyncify-propagate-addlist");

    // Ensure there is a memory, as we need it.

    if (secondaryMemory) {
      auto secondaryMemorySizeString =
        getArgumentOrDefault("asyncify-secondary-memory-size", "1");
      Address secondaryMemorySize = std::stoi(secondaryMemorySizeString);
      asyncifyMemory = createSecondaryMemory(module, secondaryMemorySize);
    } else {
      if (module->memories.size() <= 1) {
        MemoryUtils::ensureExists(module);
        asyncifyMemory = module->memories[0]->name;
      } else {
        auto asyncifyMemoryValue =
          getArgumentOrDefault("asyncify-memory", "memory");
        for (auto& theExport : module->exports) {
          if (theExport->kind == ExternalKind::Memory &&
              theExport->name == asyncifyMemoryValue) {
            asyncifyMemory = *theExport->getInternalName();
            break;
          }
        }
        if (!asyncifyMemory) {
          Fatal() << "Please specify which of the multiple memories to use, "
                     "with --pass-arg=asyncify-memory@memory";
        }
      }
    }
    pointerType =
      module->getMemory(asyncifyMemory)->is64() ? Type::i64 : Type::i32;

    removeList = handleBracketingOperators(removeList);
    addList = handleBracketingOperators(addList);
    onlyList = handleBracketingOperators(onlyList);

    if (!onlyList.empty() && (!removeList.empty() || !addList.empty())) {
      Fatal() << "It makes no sense to use both an asyncify only-list together "
                 "with another list.";
    }

    auto canImportChangeState = [&](Name module, Name base) {
      if (allImportsCanChangeState) {
        return true;
      }
      auto full = getFullImportName(module, base);
      for (auto& listedImport : listedImports) {
        if (String::wildcardMatch(listedImport, full)) {
          return true;
        }
      }
      return false;
    };

    // Scan the module.
    ModuleAnalyzer analyzer(*module,
                            canImportChangeState,
                            canIndirectChangeState,
                            removeList,
                            addList,
                            propagateAddList,
                            onlyList,
                            verbose);

    // Add necessary globals before we emit code to use them.
    addGlobals(module, relocatable);

    // Compute the set of functions we will instrument. All of the passes we run
    // below only need to run there.
    PassUtils::FuncSet instrumentedFuncs;
    for (auto& func : module->functions) {
      if (analyzer.needsInstrumentation(func.get())) {
        instrumentedFuncs.insert(func.get());
      }
    }

    // Instrument the flow of code, adding code instrumentation and
    // skips for when rewinding. We do this on flat IR so that it is
    // practical to add code around each call, without affecting
    // anything else.
    {
      PassUtils::FilteredPassRunner runner(module, instrumentedFuncs);
      runner.add("flatten");
      // Dce is useful here, since AsyncifyFlow makes control flow conditional,
      // which may make unreachable code look reachable. It also lets us ignore
      // unreachable code here.
      runner.add("dce");
      if (optimize) {
        // Optimizing before AsyncifyFlow is crucial, especially coalescing,
        // because the flow changes add many branches, break up if-elses, etc.,
        // all of which extend the live ranges of locals. In other words, it is
        // not possible to coalesce well afterwards.
        runner.add("remove-unused-names");
        runner.add("simplify-locals-nonesting");
        runner.add("reorder-locals");
        runner.add("coalesce-locals");
        runner.add("simplify-locals-nonesting");
        runner.add("reorder-locals");
        runner.add("merge-blocks");
      }
      runner.add(
        std::make_unique<AsyncifyFlow>(&analyzer, pointerType, asyncifyMemory));
      runner.setIsNested(true);
      runner.setValidateGlobally(false);
      runner.run();
    }
    if (asserts) {
      // Add asserts in non-instrumented code. Note we do not use an
      // instrumented pass runner here as we do want to run on all functions.
      PassRunner runner(module);
      runner.add(std::make_unique<AsyncifyAssertInNonInstrumented>(
        &analyzer, pointerType, asyncifyMemory));
      runner.setIsNested(true);
      runner.setValidateGlobally(false);
      runner.run();
    }
    // Next, add local saving/restoring logic. We optimize before doing this,
    // to undo the extra code generated by flattening, and to arrive at the
    // minimal amount of locals (which is important as we must save and
    // restore those locals). We also and optimize after as well to simplify
    // the code as much as possible.
    {
      PassUtils::FilteredPassRunner runner(module, instrumentedFuncs);
      if (optimize) {
        runner.addDefaultFunctionOptimizationPasses();
      }
      runner.add(std::make_unique<AsyncifyLocals>(
        &analyzer, pointerType, asyncifyMemory));
      if (optimize) {
        runner.addDefaultFunctionOptimizationPasses();
      }
      runner.setIsNested(true);
      runner.setValidateGlobally(false);
      runner.run();
    }
    // Finally, add function support (that should not have been seen by
    // the previous passes).
    addFunctions(module);
  }